

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_operators.cpp
# Opt level: O0

void test_parse_and_compare_reverse<bool(*)(semver::version<int,int,int>const&,semver::version<int,int,int>const&)noexcept>
               (string_view v1,string_view v2,
               _func_bool_version<int,_int,_int>_ptr_version<int,_int,_int>_ptr *op)

{
  bool bVar1;
  from_chars_result fVar2;
  Decomposer local_362;
  ExprLhs<bool> local_361;
  StringRef local_360;
  SourceLineInfo local_350;
  StringRef local_340;
  undefined1 local_330 [8];
  AssertionHandler catchAssertionHandler_3;
  StringRef local_2e0;
  SourceLineInfo local_2d0;
  StringRef local_2c0;
  undefined1 local_2b0 [8];
  AssertionHandler catchAssertionHandler_2;
  from_chars_result local_258;
  Decomposer local_241;
  ExprLhs<const_semver::from_chars_result_&> local_240;
  StringRef local_238;
  SourceLineInfo local_228;
  StringRef local_218;
  undefined1 local_208 [8];
  AssertionHandler catchAssertionHandler_1;
  version<int,_int,_int> parsed_v2;
  from_chars_result local_140;
  Decomposer local_129;
  ExprLhs<const_semver::from_chars_result_&> local_128 [3];
  StringRef local_110;
  SourceLineInfo local_100;
  StringRef local_f0;
  undefined1 local_e0 [8];
  AssertionHandler catchAssertionHandler;
  version<int,_int,_int> parsed_v1;
  _func_bool_version<int,_int,_int>_ptr_version<int,_int,_int>_ptr *op_local;
  string_view v2_local;
  string_view v1_local;
  
  semver::version<int,_int,_int>::version
            ((version<int,_int,_int> *)&catchAssertionHandler.m_resultCapture);
  local_f0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp"
             ,8);
  Catch::StringRef::StringRef(&local_110,"semver::parse(v1, parsed_v1)");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_e0,&local_f0,&local_100,local_110,Normal);
  fVar2 = semver::parse<int,int,int>
                    (v1,(version<int,_int,_int> *)&catchAssertionHandler.m_resultCapture);
  local_140.super_from_chars_result.ptr = fVar2.super_from_chars_result.ptr;
  local_140.super_from_chars_result.ec = fVar2.super_from_chars_result.ec;
  local_128[0] = Catch::Decomposer::operator<=(&local_129,&local_140);
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            ((AssertionHandler *)local_e0,local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_e0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_e0);
  semver::version<int,_int,_int>::version
            ((version<int,_int,_int> *)&catchAssertionHandler_1.m_resultCapture);
  local_218 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_228,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp"
             ,0xb);
  Catch::StringRef::StringRef(&local_238,"semver::parse(v2, parsed_v2)");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,&local_218,&local_228,local_238,Normal);
  catchAssertionHandler_2.m_resultCapture = (IResultCapture *)v2._M_len;
  fVar2 = semver::parse<int,int,int>
                    (v2,(version<int,_int,_int> *)&catchAssertionHandler_1.m_resultCapture);
  local_258.super_from_chars_result.ptr = fVar2.super_from_chars_result.ptr;
  local_258.super_from_chars_result.ec = fVar2.super_from_chars_result.ec;
  local_240 = Catch::Decomposer::operator<=(&local_241,&local_258);
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            ((AssertionHandler *)local_208,&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_208);
  local_2c0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2d0,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp"
             ,0xd);
  Catch::StringRef::StringRef(&local_2e0,"op(parsed_v1, parsed_v2)");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2b0,&local_2c0,&local_2d0,local_2e0,Normal);
  bVar1 = (*op)((version<int,_int,_int> *)&catchAssertionHandler.m_resultCapture,
                (version<int,_int,_int> *)&catchAssertionHandler_1.m_resultCapture);
  catchAssertionHandler_3.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_3.m_resultCapture + 6),bVar1);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)local_2b0,
             (ExprLhs<bool> *)((long)&catchAssertionHandler_3.m_resultCapture + 7));
  Catch::AssertionHandler::complete((AssertionHandler *)local_2b0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2b0);
  local_340 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_350,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp"
             ,0xe);
  Catch::StringRef::StringRef(&local_360,"op(parsed_v2, parsed_v1)");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,&local_340,&local_350,local_360,Normal);
  bVar1 = (*op)((version<int,_int,_int> *)&catchAssertionHandler_1.m_resultCapture,
                (version<int,_int,_int> *)&catchAssertionHandler.m_resultCapture);
  local_361 = Catch::Decomposer::operator<=(&local_362,bVar1);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_330,&local_361);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_330);
  semver::version<int,_int,_int>::~version
            ((version<int,_int,_int> *)&catchAssertionHandler_1.m_resultCapture);
  semver::version<int,_int,_int>::~version
            ((version<int,_int,_int> *)&catchAssertionHandler.m_resultCapture);
  return;
}

Assistant:

static void test_parse_and_compare_reverse(const std::string_view v1, const std::string_view v2, Operator op) {
  semver::version parsed_v1;
  REQUIRE(semver::parse(v1, parsed_v1));

  semver::version parsed_v2;
  REQUIRE(semver::parse(v2, parsed_v2));

  REQUIRE(op(parsed_v1, parsed_v2));
  REQUIRE(op(parsed_v2, parsed_v1));
}